

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

uint32 setup_obs(uint32 ts,uint32 strm,uint32 n_frame,uint32 n_stream,uint32 *veclen,uint32 blksize)

{
  uint32 uVar1;
  int iVar2;
  void *ptr;
  void *ptr_00;
  ulong uVar3;
  char *fmt;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 local_58;
  uint local_50;
  uint32 n_i_frame;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_40 = (ulong)strm;
  uVar7 = veclen[local_40];
  uVar3 = (ulong)uVar7;
  vlen = uVar7;
  if (multiclass == '\x01') {
    uVar9 = n_frame / stride;
    if ((l_ts != ts) || (l_strm != strm)) {
      n_tot_frame = n_tot_frame + uVar9;
      l_ts = ts;
      l_strm = strm;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
              ,0x130,"alloc\'ing %uMb obs buf\n",(ulong)(uVar9 * uVar7 >> 0x12));
      if (obuf != (float32 *)0x0) {
        ckd_free(obuf);
        obuf = (float32 *)0x0;
      }
      obuf = (float32 *)
             __ckd_calloc__((ulong)(uVar9 * uVar7),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                            ,0x136);
      if (stride == 1) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x139,"Reading all frames\n");
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x13c,"Reading 1 out of every %u frames from obs dmp file...\n");
      }
      local_50 = uVar9;
      if (o2d == (uint32 **)0x0) {
        uVar10 = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x158,"dmp mdef == output mdef\n");
        uVar9 = 0;
        while (iVar2 = segdmp_next_feat(ts,(vector_t ***)&local_58,&n_i_frame), iVar2 != 0) {
          if (n_i_frame != 1) {
            __assert_fail("n_i_frame == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                          ,0x15a,"uint32 setup_obs_multiclass(uint32, uint32, uint32, uint32)");
          }
          if (uVar9 % stride == 0) {
            memcpy(obuf + uVar10,
                   *(void **)(*(long *)CONCAT44(local_58._4_4_,(uint32)local_58) + local_40 * 8),
                   uVar3 * 4);
            uVar10 = (ulong)((int)uVar10 + uVar7);
          }
          ckd_free((void *)**(undefined8 **)CONCAT44(local_58._4_4_,(uint32)local_58));
          ckd_free_2d((void *)CONCAT44(local_58._4_4_,(uint32)local_58));
          uVar9 = uVar9 + 1;
        }
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x140,"o_ts == %u ->",(ulong)ts);
        local_48 = (ulong)ts;
        for (uVar10 = 0; uVar10 < n_o2d[local_48]; uVar10 = uVar10 + 1) {
          err_msg(ERR_INFOCONT,(char *)0x0,0," %d",(ulong)o2d[local_48][uVar10]);
        }
        err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
        uVar10 = 0;
        uVar5 = 0;
        while (uVar5 < n_o2d[local_48]) {
          uVar1 = o2d[local_48][uVar5];
          uVar6 = 0;
          local_38 = uVar5;
          while (iVar2 = segdmp_next_feat(uVar1,(vector_t ***)&local_58,&n_i_frame), iVar2 != 0) {
            if (n_i_frame != 1) {
              __assert_fail("n_i_frame == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                            ,0x14a,"uint32 setup_obs_multiclass(uint32, uint32, uint32, uint32)");
            }
            if ((int)(uVar6 % (ulong)stride) == 0) {
              memcpy(obuf + uVar10,
                     *(void **)(*(long *)CONCAT44(local_58._4_4_,(uint32)local_58) + local_40 * 8),
                     uVar3 * 4);
              uVar10 = (ulong)((int)uVar10 + uVar7);
            }
            ckd_free((void *)**(undefined8 **)CONCAT44(local_58._4_4_,(uint32)local_58));
            ckd_free_2d((void *)CONCAT44(local_58._4_4_,(uint32)local_58));
            uVar6 = (ulong)((int)uVar6 + 1);
          }
          uVar5 = local_38 + 1;
        }
      }
      uVar7 = local_50;
      uVar5 = (ulong)local_50;
      if ((uint)(uVar10 / uVar3) != local_50) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x169,"Expected %u frames, but read %u\n",(ulong)local_50,uVar10 / uVar3);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
              ,0x16c,"done reading %u frames\n",uVar5);
      return uVar7;
    }
    lVar4 = 0x126;
  }
  else {
    local_58._0_4_ = 0;
    uVar9 = n_frame / stride;
    if (l_strm != strm) {
      local_48 = CONCAT44(local_48._4_4_,n_frame);
      n_tot_frame = n_tot_frame + uVar9;
      uVar3 = 0;
      l_strm = strm;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
              ,0xed,"alloc\'ing %uMb obs buf\n",(ulong)(uVar9 * uVar7 >> 0x12));
      if (obuf != (float32 *)0x0) {
        ckd_free(obuf);
        obuf = (float32 *)0x0;
      }
      local_50 = uVar9;
      obuf = (float32 *)
             __ckd_calloc__((ulong)(veclen[local_40] * uVar9),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                            ,0xf3);
      ptr = __ckd_calloc__((ulong)blksize,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                           ,0xf5);
      ptr_00 = __ckd_calloc__((ulong)n_stream,8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                              ,0xf6);
      for (uVar10 = 0; n_stream != uVar10; uVar10 = uVar10 + 1) {
        *(void **)((long)ptr_00 + uVar10 * 8) = (void *)(uVar3 * 4 + (long)ptr);
        uVar3 = (ulong)((uint32)uVar3 + veclen[uVar10]);
      }
      if ((uint32)uVar3 == blksize) {
        uVar7 = (uint)local_48;
        if (dmp_fp == (FILE *)0x0) {
          __assert_fail("dmp_fp != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                        ,0xfd,"uint32 setup_obs_1class(uint32, uint32, uint32, uint32 *, uint32)");
        }
        uVar9 = 0;
        iVar2 = fseek((FILE *)dmp_fp,data_offset,0);
        if (iVar2 < 0) {
          fmt = "Can\'t seek to start of data\n";
          lVar4 = 0x100;
        }
        else {
          uVar8 = 0;
          local_38 = CONCAT44(local_38._4_4_,blksize);
          while( true ) {
            if (uVar7 == uVar9) {
              ckd_free(ptr);
              ckd_free(ptr_00);
              return local_50;
            }
            uVar1 = bio_fread(ptr,4,blksize,dmp_fp,dmp_swp,(uint32 *)&local_58);
            uVar3 = local_40;
            if (uVar1 != blksize) break;
            if (uVar9 % stride == 0) {
              memcpy(obuf + uVar8,*(void **)((long)ptr_00 + local_40 * 8),
                     (ulong)veclen[local_40] << 2);
              uVar8 = uVar8 + veclen[uVar3];
              blksize = (uint32)local_38;
              uVar7 = (uint)local_48;
            }
            uVar9 = uVar9 + 1;
          }
          fmt = "Can\'t read dump file\n";
          lVar4 = 0x107;
        }
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                       ,lVar4,fmt);
        return 0;
      }
      __assert_fail("l == blksize",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                    ,0xfc,"uint32 setup_obs_1class(uint32, uint32, uint32, uint32 *, uint32)");
    }
    lVar4 = 0xe3;
  }
  uVar7 = n_frame / stride;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
          ,lVar4,"No need to read data; using existing buffered data\n");
  return uVar7;
}

Assistant:

uint32
setup_obs(uint32 ts, uint32 strm, uint32 n_frame, uint32 n_stream, uint32 *veclen, uint32 blksize)
{
    vlen = veclen[strm];
    if (multiclass) {
	return setup_obs_multiclass(ts, strm, n_frame, veclen[strm]);
    }
    else {
	return setup_obs_1class(strm, n_frame, n_stream, veclen, blksize);
    }
}